

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epnp.cpp
# Opt level: O2

void __thiscall
opengv::absolute_pose::modules::Epnp::compute_L_6x10
          (Epnp *this,MatrixXd *Ut,Matrix<double,_6,_10,_0,_6,_10> *L_6x10)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double *pdVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  ulong *puVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  ulong uStack_428;
  double dStack_420;
  ulong auStack_418 [16];
  ulong uStack_398;
  double dStack_390;
  ulong auStack_388 [16];
  ulong uStack_308;
  double dStack_300;
  ulong auStack_2f8 [16];
  ulong uStack_278;
  double dStack_270;
  ulong local_268 [72];
  
  pdVar6 = (Ut->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
  lVar11 = (Ut->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  puVar13 = local_268;
  for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
    iVar16 = 0xb - (int)lVar14;
    iVar17 = 0;
    iVar15 = 1;
    for (lVar12 = 0x10; lVar12 != 0xa0; lVar12 = lVar12 + 0x18) {
      *(double *)((long)puVar13 + lVar12 + -0x10) =
           *(double *)
            ((long)pdVar6 + (ulong)(uint)(iVar17 * 3) * lVar11 * 8 + (ulong)(uint)(iVar16 * 8)) -
           *(double *)((long)pdVar6 + (iVar15 * 3) * lVar11 * 8 + (ulong)(uint)(iVar16 * 8));
      iVar9 = iVar15 * 3;
      iVar10 = iVar17 * 3;
      *(double *)((long)puVar13 + lVar12 + -8) =
           *(double *)
            ((long)pdVar6 + (ulong)(iVar17 * 3 + 1) * lVar11 * 8 + (ulong)(uint)(iVar16 * 8)) -
           *(double *)((long)pdVar6 + (iVar15 * 3 + 1) * lVar11 * 8 + (ulong)(uint)(iVar16 * 8));
      iVar1 = iVar15 + 1;
      bVar8 = 2 < iVar15;
      bVar7 = iVar15 < 3;
      iVar15 = iVar17 + 2;
      if (bVar7) {
        iVar15 = iVar1;
      }
      iVar17 = (uint)bVar8 + iVar17;
      *(double *)((long)puVar13 + lVar12) =
           *(double *)((long)pdVar6 + (ulong)(iVar10 + 2) * lVar11 * 8 + (ulong)(uint)(iVar16 * 8))
           - *(double *)((long)pdVar6 + (iVar9 + 2) * lVar11 * 8 + (ulong)(uint)(iVar16 * 8));
    }
    puVar13 = puVar13 + 0x12;
  }
  lVar11 = 0x38;
  while (lVar11 != 0x4a) {
    dVar2 = (&dStack_420)[lVar11];
    auVar18._8_8_ = 0;
    auVar18._0_8_ = (&uStack_428)[lVar11];
    auVar25._8_8_ = 0;
    auVar25._0_8_ = auStack_418[lVar11];
    auVar22._8_8_ = 0;
    auVar22._0_8_ = dVar2 * dVar2;
    auVar19 = vfmadd231sd_fma(auVar22,auVar18,auVar18);
    auVar19 = vfmadd231sd_fma(auVar19,auVar25,auVar25);
    *(double *)L_6x10 = auVar19._0_8_;
    dVar3 = (&dStack_390)[lVar11];
    auVar23._8_8_ = 0;
    auVar23._0_8_ = (&uStack_398)[lVar11];
    auVar29._8_8_ = 0;
    auVar29._0_8_ = auStack_388[lVar11];
    auVar26._8_8_ = 0;
    auVar26._0_8_ = dVar2 * dVar3;
    auVar19 = vfmadd231sd_fma(auVar26,auVar18,auVar23);
    auVar19 = vfmadd231sd_fma(auVar19,auVar25,auVar29);
    *(double *)((long)L_6x10 + 0x30) = auVar19._0_8_ + auVar19._0_8_;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = dVar3 * dVar3;
    auVar19 = vfmadd231sd_fma(auVar27,auVar23,auVar23);
    auVar19 = vfmadd231sd_fma(auVar19,auVar29,auVar29);
    *(double *)((long)L_6x10 + 0x60) = auVar19._0_8_;
    dVar4 = (&dStack_300)[lVar11];
    auVar28._8_8_ = 0;
    auVar28._0_8_ = (&uStack_308)[lVar11];
    auVar34._8_8_ = 0;
    auVar34._0_8_ = auStack_2f8[lVar11];
    auVar30._8_8_ = 0;
    auVar30._0_8_ = dVar2 * dVar4;
    auVar19 = vfmadd231sd_fma(auVar30,auVar18,auVar28);
    auVar19 = vfmadd231sd_fma(auVar19,auVar25,auVar34);
    *(double *)((long)L_6x10 + 0x90) = auVar19._0_8_ + auVar19._0_8_;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = dVar3 * dVar4;
    auVar19 = vfmadd231sd_fma(auVar31,auVar23,auVar28);
    auVar19 = vfmadd231sd_fma(auVar19,auVar29,auVar34);
    *(double *)((long)L_6x10 + 0xc0) = auVar19._0_8_ + auVar19._0_8_;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = dVar4 * dVar4;
    auVar19 = vfmadd231sd_fma(auVar32,auVar28,auVar28);
    auVar19 = vfmadd231sd_fma(auVar19,auVar34,auVar34);
    *(double *)((long)L_6x10 + 0xf0) = auVar19._0_8_;
    dVar5 = (&dStack_270)[lVar11];
    auVar33._8_8_ = 0;
    auVar33._0_8_ = (&uStack_278)[lVar11];
    auVar35._8_8_ = 0;
    auVar35._0_8_ = local_268[lVar11];
    lVar11 = lVar11 + 3;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = dVar5 * dVar2;
    auVar19 = vfmadd231sd_fma(auVar19,auVar33,auVar18);
    auVar19 = vfmadd231sd_fma(auVar19,auVar35,auVar25);
    *(double *)((long)L_6x10 + 0x120) = auVar19._0_8_ + auVar19._0_8_;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = dVar5 * dVar3;
    auVar19 = vfmadd231sd_fma(auVar20,auVar33,auVar23);
    auVar24._8_8_ = 0;
    auVar24._0_8_ = dVar5 * dVar5;
    auVar18 = vfmadd231sd_fma(auVar24,auVar33,auVar33);
    auVar19 = vfmadd231sd_fma(auVar19,auVar35,auVar29);
    auVar18 = vfmadd231sd_fma(auVar18,auVar35,auVar35);
    *(double *)((long)L_6x10 + 0x150) = auVar19._0_8_ + auVar19._0_8_;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = dVar5 * dVar4;
    auVar19 = vfmadd231sd_fma(auVar21,auVar33,auVar28);
    auVar19 = vfmadd231sd_fma(auVar19,auVar35,auVar34);
    *(double *)((long)L_6x10 + 0x180) = auVar19._0_8_ + auVar19._0_8_;
    *(double *)((long)L_6x10 + 0x1b0) = auVar18._0_8_;
    L_6x10 = (Matrix<double,_6,_10,_0,_6,_10> *)((long)L_6x10 + 8);
  }
  return;
}

Assistant:

void
opengv::absolute_pose::modules::Epnp::compute_L_6x10(
    const Eigen::MatrixXd & Ut,
    Eigen::Matrix<double,6,10> & L_6x10 )
{
  double dv[4][6][3];

  for(int i = 0; i < 4; i++)
  {
    int a = 0, b = 1;
    for(int j = 0; j < 6; j++)
    {
      dv[i][j][0] = Ut(11-i,3 * a    ) - Ut(11-i,3 * b);
      dv[i][j][1] = Ut(11-i,3 * a + 1) - Ut(11-i,3 * b + 1);
      dv[i][j][2] = Ut(11-i,3 * a + 2) - Ut(11-i,3 * b + 2);

      b++;
      if (b > 3)
      {
        a++;
        b = a + 1;
      }
    }
  }

  for(int i = 0; i < 6; i++)
  {
    L_6x10(i,0) =        dot(dv[0][i], dv[0][i]);
    L_6x10(i,1) = 2.0f * dot(dv[0][i], dv[1][i]);
    L_6x10(i,2) =        dot(dv[1][i], dv[1][i]);
    L_6x10(i,3) = 2.0f * dot(dv[0][i], dv[2][i]);
    L_6x10(i,4) = 2.0f * dot(dv[1][i], dv[2][i]);
    L_6x10(i,5) =        dot(dv[2][i], dv[2][i]);
    L_6x10(i,6) = 2.0f * dot(dv[0][i], dv[3][i]);
    L_6x10(i,7) = 2.0f * dot(dv[1][i], dv[3][i]);
    L_6x10(i,8) = 2.0f * dot(dv[2][i], dv[3][i]);
    L_6x10(i,9) =        dot(dv[3][i], dv[3][i]);
  }
}